

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O2

void idx2::Dealloc(brick_pool *Bp)

{
  allocator *paVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  volume *local_28;
  brick_pool *local_20;
  long local_18;
  
  paVar1 = (Bp->ResolutionLevels).Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&Bp->ResolutionLevels);
  (Bp->ResolutionLevels).Size = 0;
  (Bp->ResolutionLevels).Capacity = 0;
  Begin<unsigned_long,idx2::brick_volume>(&Bp->BrickTable);
  while ((local_20 != Bp || (local_18 != 1L << ((byte)(Bp->BrickTable).LogCapacity & 0x3f)))) {
    Dealloc(local_28);
    lVar3 = local_18 << 6;
    do {
      lVar4 = lVar3;
      lVar2 = local_18 + 1;
      local_18 = local_18 + 1;
      lVar3 = lVar4 + 0x40;
    } while ((local_20->BrickTable).Stats[lVar2] != Occupied);
    local_28 = (volume *)((long)&(local_20->BrickTable).Vals[1].Vol.Buffer.Data + lVar4);
  }
  Dealloc<unsigned_long,idx2::brick_volume>(&Bp->BrickTable);
  return;
}

Assistant:

void
Dealloc(brick_pool* Bp)
{
  Dealloc(&Bp->ResolutionLevels);
  idx2_ForEach (It, Bp->BrickTable)
    Dealloc(&It.Val->Vol);
  Dealloc(&Bp->BrickTable);
}